

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-kalman-filter.cpp
# Opt level: O2

MeasureVector __thiscall
stateObservation::LinearKalmanFilter::simulateSensor_
          (LinearKalmanFilter *this,StateVector *x,uint k)

{
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  Index *this_01;
  int iVar1;
  uint __line;
  bool bVar2;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  uint in_ECX;
  undefined4 in_register_00000014;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar3;
  char *__assertion;
  MeasureVector MVar4;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  local_78;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_50;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_40;
  
  this_00 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(x + 0x10);
  bVar2 = KalmanFilterBase::checkCmatrix((KalmanFilterBase *)x,(Cmatrix *)this_00);
  if (!bVar2) {
    __assertion = "checkCmatrix(c_) && \"ERROR: The C is not initialized\"";
    __line = 0x39;
LAB_001df8dd:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/linear-kalman-filter.cpp"
                  ,__line,
                  "virtual ObserverBase::MeasureVector stateObservation::LinearKalmanFilter::simulateSensor_(const StateVector &, unsigned int)"
                 );
  }
  if ((*(int *)((long)&(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_rows + 4) !=
       *(int *)&x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data) ||
     (iVar1 = (int)x[0x27].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows,
     *(int *)&x[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
     != iVar1)) {
    __assertion = "checkDmatrix(d_) && \"ERROR: The D is not initialized\"";
    __line = 0x3a;
    goto LAB_001df8dd;
  }
  if (iVar1 != 0) {
    this_01 = &x[0x26].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
    getDmatrixZero((Dmatrix *)&local_78,(LinearKalmanFilter *)x);
    bVar2 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator!=
                      ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_01,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_78);
    free(local_78.m_lhs.m_lhs);
    if (bVar2) {
      bVar2 = IndexedMatrixArray::checkIndex((IndexedMatrixArray *)(x + 9),in_ECX);
      if (!bVar2) {
        __assertion = 
        "u_.checkIndex(k) && \"ERROR: The input feedthrough of the measurements is not set                              (the measurement at time k needs the input at time k which was not given)                              if you don\'t need the input in the computation of measurement, you                              must set D matrix to zero\""
        ;
        __line = 0x42;
        goto LAB_001df8dd;
      }
      local_40 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           (this_00,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                    CONCAT44(in_register_00000014,k));
      other = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              IndexedMatrixArray::operator[]((IndexedMatrixArray *)(x + 9),in_ECX);
      local_50 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_01,other);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
      ::operator+(&local_78,
                  (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                   *)&local_40,
                  (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                   *)&local_50);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
                  *)&local_78);
      IVar3 = extraout_RDX;
      goto LAB_001df882;
    }
  }
  local_78.m_lhs =
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                 (this_00,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          CONCAT44(in_register_00000014,k));
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)this,&local_78.m_lhs);
  IVar3 = extraout_RDX_00;
LAB_001df882:
  MVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar3;
  MVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (MeasureVector)
         MVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

ObserverBase::MeasureVector LinearKalmanFilter::simulateSensor_(const StateVector& x, unsigned k)
    {

        BOOST_ASSERT(checkCmatrix(c_) && "ERROR: The C is not initialized");
        BOOST_ASSERT(checkDmatrix(d_) && "ERROR: The D is not initialized");

        if (p_>0 && d_!=getDmatrixZero())
        {
                BOOST_ASSERT(u_.checkIndex(k) &&
                             "ERROR: The input feedthrough of the measurements is not set \
                             (the measurement at time k needs the input at time k which was not given) \
                             if you don't need the input in the computation of measurement, you \
                             must set D matrix to zero");
                return c_*x+d_*u_[k];

        }
        else
        {
            return ObserverBase::MeasureVector(c_*x);
        }

    }